

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3EvalPhraseMergeToken(Fts3Table *pTab,Fts3Phrase *p,int iToken,char *pList,int nList)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  sqlite3_int64 *pVal;
  long lVar4;
  uint bDescIdx;
  char *p_00;
  int iVar5;
  char *pcVar6;
  char **pp;
  uint bDescIdx_00;
  char *pcVar7;
  int iVar8;
  int local_a8;
  int local_a4;
  char *p_1;
  sqlite3_int64 i1;
  Fts3Phrase *local_90;
  sqlite3_int64 iPrev;
  int local_80;
  int local_7c;
  char *local_78;
  char *local_70;
  char *local_68;
  char *p2;
  char *p1;
  sqlite3_int64 i2;
  char *local_48;
  sqlite3_int64 local_40;
  char *local_38;
  
  local_80 = iToken;
  if (pList == (char *)0x0) {
    sqlite3_free((p->doclist).aAll);
    (p->doclist).aAll = (char *)0x0;
    (p->doclist).nAll = 0;
  }
  else {
    iVar2 = p->iDoclistToken;
    if (iVar2 < 0) {
      (p->doclist).aAll = pList;
      (p->doclist).nAll = nList;
    }
    else {
      pcVar6 = (p->doclist).aAll;
      if (pcVar6 != (char *)0x0) {
        iVar8 = (p->doclist).nAll;
        local_a4 = iVar2 - iToken;
        p_00 = pList;
        iVar5 = nList;
        if (iVar2 < iToken) {
          local_a4 = iToken - iVar2;
          p_00 = pcVar6;
          pcVar6 = pList;
          iVar5 = iVar8;
          iVar8 = nList;
        }
        bVar1 = pTab->bDescIdx;
        i1 = 0;
        i2 = 0;
        iPrev = 0;
        local_a8 = 0;
        pcVar3 = pcVar6;
        local_90 = p;
        p2 = pcVar6;
        p1 = p_00;
        if ((bVar1 == 0) || (pcVar3 = (char *)sqlite3_malloc(iVar8 + 10), pcVar3 != (char *)0x0)) {
          local_68 = p_00 + iVar5;
          pcVar7 = pcVar6 + iVar8;
          p_1 = pcVar3;
          local_78 = pcVar6;
          local_70 = p_00;
          local_48 = pcVar3;
          fts3GetDeltaVarint3(&p1,local_68,0,&i1);
          bDescIdx = 0;
          pVal = &i2;
          pcVar6 = pcVar7;
          pp = &p2;
          while( true ) {
            fts3GetDeltaVarint3(pp,pcVar6,bDescIdx,pVal);
            pcVar3 = local_48;
            bDescIdx = (uint)bVar1;
            if ((p1 == (char *)0x0) || (p2 == (char *)0x0)) break;
            bDescIdx_00 = (uint)bVar1;
            lVar4 = -(i1 - i2);
            if (bDescIdx_00 == 0) {
              lVar4 = i1 - i2;
            }
            if (lVar4 == 0) {
              local_38 = p_1;
              local_40 = iPrev;
              local_7c = local_a8;
              fts3PutDeltaVarint3(&p_1,bDescIdx_00,&iPrev,&local_a8,i1);
              iVar2 = fts3PoslistPhraseMerge(&p_1,local_a4,0,1,&p1,&p2);
              if (iVar2 == 0) {
                p_1 = local_38;
                iPrev = local_40;
                local_a8 = local_7c;
              }
              fts3GetDeltaVarint3(&p1,local_68,bDescIdx_00,&i1);
              pVal = &i2;
              pcVar6 = pcVar7;
              pp = &p2;
            }
            else if (lVar4 < 0) {
              fts3PoslistCopy((char **)0x0,&p1);
              pVal = &i1;
              pcVar6 = local_68;
              pp = &p1;
            }
            else {
              fts3PoslistCopy((char **)0x0,&p2);
              pVal = &i2;
              pcVar6 = pcVar7;
              pp = &p2;
            }
          }
          iVar8 = (int)p_1 - (int)local_48;
          iVar2 = 0;
          p_00 = local_70;
          pcVar6 = local_78;
          if (bDescIdx != 0) {
            sqlite3_free(local_78);
            p_00 = local_70;
            pcVar6 = pcVar3;
          }
        }
        else {
          iVar2 = 7;
        }
        p = local_90;
        sqlite3_free(p_00);
        (p->doclist).aAll = pcVar6;
        (p->doclist).nAll = iVar8;
        goto LAB_0016ede0;
      }
      sqlite3_free(pList);
    }
  }
  iVar2 = 0;
LAB_0016ede0:
  if (p->iDoclistToken < local_80) {
    p->iDoclistToken = local_80;
  }
  return iVar2;
}

Assistant:

static int fts3EvalPhraseMergeToken(
  Fts3Table *pTab,                /* FTS Table pointer */
  Fts3Phrase *p,                  /* Phrase to merge pList/nList into */
  int iToken,                     /* Token pList/nList corresponds to */
  char *pList,                    /* Pointer to doclist */
  int nList                       /* Number of bytes in pList */
){
  int rc = SQLITE_OK;
  assert( iToken!=p->iDoclistToken );

  if( pList==0 ){
    sqlite3_free(p->doclist.aAll);
    p->doclist.aAll = 0;
    p->doclist.nAll = 0;
  }

  else if( p->iDoclistToken<0 ){
    p->doclist.aAll = pList;
    p->doclist.nAll = nList;
  }

  else if( p->doclist.aAll==0 ){
    sqlite3_free(pList);
  }

  else {
    char *pLeft;
    char *pRight;
    int nLeft;
    int nRight;
    int nDiff;

    if( p->iDoclistToken<iToken ){
      pLeft = p->doclist.aAll;
      nLeft = p->doclist.nAll;
      pRight = pList;
      nRight = nList;
      nDiff = iToken - p->iDoclistToken;
    }else{
      pRight = p->doclist.aAll;
      nRight = p->doclist.nAll;
      pLeft = pList;
      nLeft = nList;
      nDiff = p->iDoclistToken - iToken;
    }

    rc = fts3DoclistPhraseMerge(
        pTab->bDescIdx, nDiff, pLeft, nLeft, &pRight, &nRight
    );
    sqlite3_free(pLeft);
    p->doclist.aAll = pRight;
    p->doclist.nAll = nRight;
  }

  if( iToken>p->iDoclistToken ) p->iDoclistToken = iToken;
  return rc;
}